

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persp_lh_no.c
# Opt level: O1

void glmc_persp_sizes_lh_no(vec4 *proj,float fovy,float *dest)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  
  fVar1 = tanf(fovy * 0.5);
  auVar2._4_4_ = proj[1][1];
  auVar2._0_4_ = proj[3][2];
  auVar2._8_8_ = 0;
  auVar3._4_4_ = (*proj)[0];
  auVar3._0_4_ = -1.0 - proj[2][2];
  auVar3._8_8_ = 0;
  auVar3 = divps(auVar2,auVar3);
  fVar4 = (proj[3][2] / (1.0 - proj[2][2])) * (fVar1 + fVar1);
  dest[3] = fVar4;
  fVar1 = (fVar1 + fVar1) * auVar3._0_4_;
  *dest = auVar3._4_4_ * fVar1;
  *(ulong *)(dest + 1) = CONCAT44(fVar4 * auVar3._4_4_,fVar1);
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_persp_sizes_lh_no(mat4 proj, float fovy, vec4 dest) {
  glm_persp_sizes_lh_no(proj, fovy, dest);
}